

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O2

void xrep0_pipe_close(void *arg)

{
  nni_mtx *mtx;
  long lVar1;
  uint32_t uVar2;
  
  lVar1 = *(long *)((long)arg + 8);
  nni_aio_close((nni_aio *)((long)arg + 0x18));
  nni_aio_close((nni_aio *)((long)arg + 0x1e0));
  nni_aio_close((nni_aio *)((long)arg + 0x3a8));
  nni_aio_close((nni_aio *)((long)arg + 0x570));
  nni_msgq_close(*(nni_msgq **)((long)arg + 0x10));
  mtx = (nni_mtx *)(lVar1 + 0x10);
  nni_mtx_lock(mtx);
  uVar2 = nni_pipe_id(*arg);
  nni_id_remove((nni_id_map *)(lVar1 + 0x40),(ulong)uVar2);
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
xrep0_pipe_close(void *arg)
{
	xrep0_pipe *p = arg;
	xrep0_sock *s = p->rep;

	nni_aio_close(&p->aio_getq);
	nni_aio_close(&p->aio_send);
	nni_aio_close(&p->aio_recv);
	nni_aio_close(&p->aio_putq);
	nni_msgq_close(p->sendq);

	nni_mtx_lock(&s->lk);
	nni_id_remove(&s->pipes, nni_pipe_id(p->pipe));
	nni_mtx_unlock(&s->lk);
}